

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  Channel *this_00;
  pointer *pppAVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  AnalyzerSettingInterfaceChannel *pAVar3;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *this_02;
  Channel *pCVar4;
  iterator __position;
  uint uVar5;
  U32 i;
  long lVar6;
  ulong uVar7;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  char text [64];
  AnalyzerSettingInterfaceChannel *local_90;
  vector<Channel,_std::allocator<Channel>_> *local_88;
  vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
  *local_80;
  Channel local_78 [72];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0010bd68;
  local_88 = &this->mDataChannels;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->mClockChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  local_80 = (vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
              *)&this->mDataChannelsInterface;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClockChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mClockEdgeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  uVar7 = 0;
  do {
    Channel::Channel(local_78,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    pCVar4 = local_78;
    std::vector<Channel,_std::allocator<Channel>_>::emplace_back<Channel>(local_88,local_78);
    Channel::~Channel(local_78);
    pAVar3 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
    local_90 = pAVar3;
    sprintf((char *)local_78,"D%d",uVar7 & 0xffffffff);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)local_90,(char *)local_78);
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)local_90);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(local_90,0));
    __position._M_current =
         (this->mDataChannelsInterface).
         super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mDataChannelsInterface).
        super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
      ::_M_realloc_insert<AnalyzerSettingInterfaceChannel*const&>(local_80,__position,&local_90);
    }
    else {
      *__position._M_current = local_90;
      pppAVar1 = &(this->mDataChannelsInterface).
                  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x10);
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new
                      ((AnalyzerSettingInterface *)0x18,(ulong)__position._M_current);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar3 = (this->mClockChannelInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  (this->mClockChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl = this_01;
  if (pAVar3 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar3 + 8))();
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mClockChannelInterface)._M_t.
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl,
             "Clock");
  pCVar4 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (this->mClockChannelInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  this_02 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  pAVar2 = (this->mClockEdgeInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mClockEdgeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = this_02;
  if (pAVar2 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mClockEdgeInterface)._M_t.
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                     _M_head_impl,"Clock State");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mClockEdgeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Rising edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mClockEdgeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Falling edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mClockEdgeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Dual edge");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mClockEdge);
  lVar6 = 0;
  do {
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  lVar6 = 0;
  uVar7 = 0;
  do {
    sprintf((char *)local_78,"D%d",uVar7 & 0xffffffff);
    AnalyzerSettings::AddChannel
              ((Channel *)this,
               (char *)((this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6),SUB81(local_78,0));
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while (uVar7 != 0x10);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ), mClockEdge( ParallelAnalyzerClockEdge::PosEdge )
{
    U32 count = 16;
    for( U32 i = 0; i < count; i++ )
    {
        mDataChannels.push_back( UNDEFINED_CHANNEL );
        AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();

        char text[ 64 ];
        sprintf( text, "D%d", i );

        data_channel_interface->SetTitleAndTooltip( text, text );
        data_channel_interface->SetChannel( mDataChannels[ i ] );
        data_channel_interface->SetSelectionOfNoneIsAllowed( true );

        mDataChannelsInterface.push_back( data_channel_interface );
    }


    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "Clock", "Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mClockEdgeInterface->SetTitleAndTooltip( "Clock State", "Define whether the data is valid on Clock rising or falling edge" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::PosEdge ), "Rising edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::NegEdge ), "Falling edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::DualEdge ), "Dual edge", "" );
    mClockEdgeInterface->SetNumber( static_cast<double>( mClockEdge ) );


    for( U32 i = 0; i < count; i++ )
    {
        AddInterface( mDataChannelsInterface[ i ] );
    }

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mClockEdgeInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, false );
    }

    AddChannel( mClockChannel, "Clock", false );
}